

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsInputGetVector(HelicsInput inp,double *data,int maxlen,int *actualSize,HelicsError *err)

{
  int iVar1;
  HelicsInput pvVar2;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (inp == (HelicsInput)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a94c9;
    }
    else {
      pvVar2 = (HelicsInput)0x0;
      if (*inp == 0x3456e052) {
        pvVar2 = inp;
      }
      if (*inp == 0x3456e052 || err == (HelicsError *)0x0) goto LAB_001a94cb;
    }
    err->error_code = -3;
    err->message = "The given input object does not point to a valid object";
  }
LAB_001a94c9:
  pvVar2 = (HelicsInput)0x0;
LAB_001a94cb:
  if (actualSize != (int *)0x0) {
    *actualSize = 0;
  }
  if (pvVar2 != (HelicsInput)0x0) {
    if (data == (double *)0x0 || maxlen < 1) {
      helics::Input::clearUpdate(*(Input **)((long)pvVar2 + 0x18));
      return;
    }
    iVar1 = helics::Input::getValue(*(Input **)((long)pvVar2 + 0x18),data,maxlen);
    if (actualSize != (int *)0x0) {
      *actualSize = iVar1;
    }
  }
  return;
}

Assistant:

void helicsInputGetVector(HelicsInput inp, double data[], int maxlen, int* actualSize, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (actualSize != nullptr) {
        *actualSize = 0;
    }
    if (inpObj == nullptr) {
        return;
    }
    if ((data == nullptr) || (maxlen <= 0)) {
        inpObj->inputPtr->clearUpdate();
        // this isn't an error, just no data retrieved
        return;
    }
    try {
        const int length = inpObj->inputPtr->getValue(data, maxlen);
        if (actualSize != nullptr) {
            *actualSize = length;
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}